

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O0

void column_test_base_boundary_z2_methods<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,false>>>>
               (void)

{
  initializer_list<bool> __l;
  initializer_list<bool> __l_00;
  initializer_list<unsigned_int> __l_01;
  initializer_list<bool> __l_02;
  initializer_list<unsigned_int> __l_03;
  undefined8 uVar1;
  bool bVar2;
  uint columnIndex;
  size_type sVar3;
  lazy_ostream *plVar4;
  undefined4 local_594;
  size_t local_590;
  basic_cstring<const_char> local_588;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_578;
  basic_cstring<const_char> local_550;
  basic_cstring<const_char> local_540;
  basic_cstring<const_char> local_530;
  basic_cstring<const_char> local_520;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_510;
  vector<bool,_std::allocator<bool>_> local_4f0;
  assertion_result local_4c8;
  basic_cstring<const_char> local_4b0;
  basic_cstring<const_char> local_4a0;
  initializer_list<bool> local_490;
  undefined4 local_47c;
  size_t local_478;
  basic_cstring<const_char> local_470;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_460;
  basic_cstring<const_char> local_438;
  basic_cstring<const_char> local_428;
  basic_cstring<const_char> local_418;
  basic_cstring<const_char> local_408;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_3f8;
  vector<bool,_std::allocator<bool>_> local_3d8;
  assertion_result local_3b0;
  basic_cstring<const_char> local_398;
  basic_cstring<const_char> local_388;
  bool local_377 [7];
  iterator local_370;
  undefined8 local_368;
  undefined4 local_35c;
  size_t local_358;
  basic_cstring<const_char> local_350;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_340;
  basic_cstring<const_char> local_318;
  basic_cstring<const_char> local_308;
  basic_cstring<const_char> local_2f8;
  basic_cstring<const_char> local_2e8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_2d8;
  vector<bool,_std::allocator<bool>_> local_2b8;
  assertion_result local_290;
  basic_cstring<const_char> local_278;
  basic_cstring<const_char> local_268;
  bool local_257 [7];
  iterator local_250;
  undefined8 local_248;
  allocator<unsigned_int> local_239;
  uint local_238 [8];
  iterator local_218;
  size_type local_210;
  undefined1 local_208 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> permutation;
  size_t local_1e8;
  basic_cstring<const_char> local_1e0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1d0;
  basic_cstring<const_char> local_1a8;
  basic_cstring<const_char> local_198;
  basic_cstring<const_char> local_188;
  basic_cstring<const_char> local_178;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_168;
  vector<bool,_std::allocator<bool>_> local_148;
  assertion_result local_120;
  basic_cstring<const_char> local_108;
  basic_cstring<const_char> local_f8;
  bool local_e7 [7];
  iterator local_e0;
  undefined8 local_d8;
  allocator<unsigned_int> local_c9;
  uint local_c8 [6];
  iterator local_b0;
  size_type local_a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_a0;
  undefined1 local_88 [8];
  Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>_>
  col;
  Column_z2_settings local_31;
  undefined1 local_30 [7];
  Column_settings settings;
  vector<bool,_std::allocator<bool>_> veccont;
  
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)local_30);
  Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>
  ::Column_z2_settings::Column_z2_settings(&local_31);
  local_c8[0] = 0;
  local_c8[1] = 1;
  local_c8[2] = 2;
  local_c8[3] = 5;
  local_c8[4] = 6;
  local_b0 = local_c8;
  local_a8 = 5;
  std::allocator<unsigned_int>::allocator(&local_c9);
  __l_03._M_len = local_a8;
  __l_03._M_array = local_b0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_a0,__l_03,&local_c9);
  Gudhi::persistence_matrix::
  Intrusive_set_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,false>>>
  ::Intrusive_set_column<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Intrusive_set_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,false>>>
              *)local_88,&local_a0,&local_31);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_a0);
  std::allocator<unsigned_int>::~allocator(&local_c9);
  local_e7[0] = true;
  local_e7[1] = true;
  local_e7[2] = true;
  local_e7[3] = false;
  local_e7[4] = false;
  local_e7[5] = true;
  local_e7[6] = true;
  local_e0 = local_e7;
  local_d8 = 7;
  __l_02._M_len = 7;
  __l_02._M_array = local_e0;
  std::vector<bool,_std::allocator<bool>_>::operator=
            ((vector<bool,_std::allocator<bool>_> *)local_30,__l_02);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_108);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_f8,0x290,&local_108);
    sVar3 = std::vector<bool,_std::allocator<bool>_>::size
                      ((vector<bool,_std::allocator<bool>_> *)local_30);
    Gudhi::persistence_matrix::
    Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>_>
    ::get_content(&local_148,
                  (Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>_>
                   *)local_88,(int)sVar3);
    bVar2 = std::operator==(&local_148,(vector<bool,_std::allocator<bool>_> *)local_30);
    boost::test_tools::assertion_result::assertion_result(&local_120,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_178,"col.get_content(veccont.size()) == veccont",0x2a);
    boost::unit_test::operator<<(&local_168,plVar4,&local_178);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_188,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_120,&local_168,&local_188,0x290,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_168);
    boost::test_tools::assertion_result::~assertion_result(&local_120);
    std::vector<bool,_std::allocator<bool>_>::~vector(&local_148);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1a8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_198,0x291,&local_1a8);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1d0,plVar4,(char (*) [1])0x28c14a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    local_1e8 = Gudhi::persistence_matrix::
                Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>_>
                ::size((Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>_>
                        *)local_88);
    permutation.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 5;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_1d0,&local_1e0,0x291,1,2,&local_1e8,"col.size()",
               (undefined1 *)
               ((long)&permutation.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 4),"5");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_1d0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_238[4] = 1;
  local_238[5] = 4;
  local_238[6] = 6;
  local_238[0] = 0;
  local_238[1] = 5;
  local_238[2] = 2;
  local_238[3] = 3;
  local_218 = local_238;
  local_210 = 7;
  std::allocator<unsigned_int>::allocator(&local_239);
  __l_01._M_len = local_210;
  __l_01._M_array = local_218;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_208,__l_01,&local_239);
  std::allocator<unsigned_int>::~allocator(&local_239);
  columnIndex = Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>
                ::get_null_value<unsigned_int>();
  Gudhi::persistence_matrix::
  Intrusive_set_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,false>>>
  ::reorder<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Intrusive_set_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,true,false>>>
              *)local_88,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_208,
             columnIndex);
  local_257[0] = true;
  local_257[1] = false;
  local_257[2] = true;
  local_257[3] = false;
  local_257[4] = true;
  local_257[5] = true;
  local_257[6] = true;
  local_250 = local_257;
  local_248 = 7;
  __l_00._M_len = 7;
  __l_00._M_array = local_250;
  std::vector<bool,_std::allocator<bool>_>::operator=
            ((vector<bool,_std::allocator<bool>_> *)local_30,__l_00);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_268,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_278);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_268,0x296,&local_278);
    sVar3 = std::vector<bool,_std::allocator<bool>_>::size
                      ((vector<bool,_std::allocator<bool>_> *)local_30);
    Gudhi::persistence_matrix::
    Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>_>
    ::get_content(&local_2b8,
                  (Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>_>
                   *)local_88,(int)sVar3);
    bVar2 = std::operator==(&local_2b8,(vector<bool,_std::allocator<bool>_> *)local_30);
    boost::test_tools::assertion_result::assertion_result(&local_290,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2e8,"col.get_content(veccont.size()) == veccont",0x2a);
    boost::unit_test::operator<<(&local_2d8,plVar4,&local_2e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2f8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_290,&local_2d8,&local_2f8,0x296,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_2d8);
    boost::test_tools::assertion_result::~assertion_result(&local_290);
    std::vector<bool,_std::allocator<bool>_>::~vector(&local_2b8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_308,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_318);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_308,0x297,&local_318);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_340,plVar4,(char (*) [1])0x28c14a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_350,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    local_358 = Gudhi::persistence_matrix::
                Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>_>
                ::size((Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>_>
                        *)local_88);
    local_35c = 5;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_340,&local_350,0x297,1,2,&local_358,"col.size()",&local_35c,"5");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_340);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::persistence_matrix::
  Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>_>
  ::clear((Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>_>
           *)local_88,2);
  Gudhi::persistence_matrix::
  Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>_>
  ::clear((Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>_>
           *)local_88,6);
  local_377[0] = true;
  local_377[1] = false;
  local_377[2] = false;
  local_377[3] = false;
  local_377[4] = true;
  local_377[5] = true;
  local_377[6] = false;
  local_370 = local_377;
  local_368 = 7;
  __l._M_len = 7;
  __l._M_array = local_370;
  std::vector<bool,_std::allocator<bool>_>::operator=
            ((vector<bool,_std::allocator<bool>_> *)local_30,__l);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_388,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_398);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_388,0x29c,&local_398);
    sVar3 = std::vector<bool,_std::allocator<bool>_>::size
                      ((vector<bool,_std::allocator<bool>_> *)local_30);
    Gudhi::persistence_matrix::
    Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>_>
    ::get_content(&local_3d8,
                  (Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>_>
                   *)local_88,(int)sVar3);
    bVar2 = std::operator==(&local_3d8,(vector<bool,_std::allocator<bool>_> *)local_30);
    boost::test_tools::assertion_result::assertion_result(&local_3b0,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_408,"col.get_content(veccont.size()) == veccont",0x2a);
    boost::unit_test::operator<<(&local_3f8,plVar4,&local_408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_418,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_3b0,&local_3f8,&local_418,0x29c,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_3f8);
    boost::test_tools::assertion_result::~assertion_result(&local_3b0);
    std::vector<bool,_std::allocator<bool>_>::~vector(&local_3d8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_428,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_438);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_428,0x29d,&local_438);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_460,plVar4,(char (*) [1])0x28c14a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_470,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    local_478 = Gudhi::persistence_matrix::
                Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>_>
                ::size((Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>_>
                        *)local_88);
    local_47c = 3;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_460,&local_470,0x29d,1,2,&local_478,"col.size()",&local_47c,"3");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_460);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::persistence_matrix::
  Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>_>
  ::clear((Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>_>
           *)local_88);
  std::initializer_list<bool>::initializer_list(&local_490);
  std::vector<bool,_std::allocator<bool>_>::operator=
            ((vector<bool,_std::allocator<bool>_> *)local_30,local_490);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4a0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_4b0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_4a0,0x2a1,&local_4b0);
    sVar3 = std::vector<bool,_std::allocator<bool>_>::size
                      ((vector<bool,_std::allocator<bool>_> *)local_30);
    Gudhi::persistence_matrix::
    Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>_>
    ::get_content(&local_4f0,
                  (Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>_>
                   *)local_88,(int)sVar3);
    bVar2 = std::operator==(&local_4f0,(vector<bool,_std::allocator<bool>_> *)local_30);
    boost::test_tools::assertion_result::assertion_result(&local_4c8,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_520,"col.get_content(veccont.size()) == veccont",0x2a);
    boost::unit_test::operator<<(&local_510,plVar4,&local_520);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_530,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_4c8,&local_510,&local_530,0x2a1,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_510);
    boost::test_tools::assertion_result::~assertion_result(&local_4c8);
    std::vector<bool,_std::allocator<bool>_>::~vector(&local_4f0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_540,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_550);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_540,0x2a2,&local_550);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_578,plVar4,(char (*) [1])0x28c14a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_588,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    local_590 = Gudhi::persistence_matrix::
                Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>_>
                ::size((Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>_>
                        *)local_88);
    local_594 = 0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_578,&local_588,0x2a2,1,2,&local_590,"col.size()",&local_594,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_578);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_208);
  Gudhi::persistence_matrix::
  Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>_>
  ::~Intrusive_set_column
            ((Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>_>
              *)local_88);
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)local_30)
  ;
  return;
}

Assistant:

void column_test_base_boundary_z2_methods() {
  std::vector<typename Column::Field_element> veccont;
  typename Column::Column_settings settings;

  Column col(std::vector<unsigned int>{0, 1, 2, 5, 6}, &settings);
  veccont = {1, 1, 1, 0, 0, 1, 1};
  BOOST_CHECK(col.get_content(veccont.size()) == veccont);
  BOOST_CHECK_EQUAL(col.size(), 5);

  std::vector<unsigned int> permutation{0, 5, 2, 3, 1, 4, 6};
  col.reorder(permutation);
  veccont = {1, 0, 1, 0, 1, 1, 1};
  BOOST_CHECK(col.get_content(veccont.size()) == veccont);
  BOOST_CHECK_EQUAL(col.size(), 5);

  col.clear(2);
  col.clear(6);
  veccont = {1, 0, 0, 0, 1, 1, 0};
  BOOST_CHECK(col.get_content(veccont.size()) == veccont);
  BOOST_CHECK_EQUAL(col.size(), 3);

  col.clear();
  veccont = {};
  BOOST_CHECK(col.get_content(veccont.size()) == veccont);
  BOOST_CHECK_EQUAL(col.size(), 0);
}